

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O2

void reportLpColVectors(HighsLogOptions *log_options,HighsLp *lp)

{
  pointer piVar1;
  long lVar2;
  ulong uVar3;
  allocator local_85;
  int local_84;
  pointer local_80;
  pointer local_78;
  string type;
  string integer_column;
  
  if (0 < lp->num_col_) {
    type._M_dataplus._M_p = (pointer)&type.field_2;
    type._M_string_length = 0;
    type.field_2._M_local_buf[0] = '\0';
    local_84 = getNumInt(lp);
    local_78 = (lp->col_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_80 = (lp->col_names_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    highsLogUser(log_options,kInfo,
                 "  Column        Lower        Upper         Cost       Type        Count");
    if (local_84 != 0) {
      highsLogUser(log_options,kInfo,"  Discrete");
    }
    if (local_80 != local_78) {
      highsLogUser(log_options,kInfo,"  Name");
    }
    highsLogUser(log_options,kInfo,"\n");
    lVar2 = 0;
    for (uVar3 = 0; (long)uVar3 < (long)lp->num_col_; uVar3 = uVar3 + 1) {
      getBoundType_abi_cxx11_
                (&integer_column,
                 (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3],
                 (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar3]);
      std::__cxx11::string::operator=((string *)&type,(string *)&integer_column);
      std::__cxx11::string::~string((string *)&integer_column);
      piVar1 = (lp->a_matrix_).start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      highsLogUser(log_options,kInfo,"%8d %12g %12g %12g         %2s %12d",
                   (lp->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3],
                   (lp->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3],
                   (lp->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar3],uVar3 & 0xffffffff,type._M_dataplus._M_p,
                   (ulong)(uint)(piVar1[uVar3 + 1] - piVar1[uVar3]));
      if (local_84 != 0) {
        std::__cxx11::string::string((string *)&integer_column,"",&local_85);
        if ((lp->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar3] == kInteger) {
          std::__cxx11::string::assign((char *)&integer_column);
        }
        highsLogUser(log_options,kInfo,"  %-8s",integer_column._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&integer_column);
      }
      if (local_80 != local_78) {
        highsLogUser(log_options,kInfo,"  %-s",
                     *(undefined8 *)
                      ((long)&(((lp->col_names_).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar2));
      }
      lVar2 = lVar2 + 0x20;
      highsLogUser(log_options,kInfo,"\n");
    }
    std::__cxx11::string::~string((string *)&type);
  }
  return;
}

Assistant:

void reportLpColVectors(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.num_col_ <= 0) return;
  std::string type;
  HighsInt count;
  bool have_integer_columns = (getNumInt(lp) != 0);
  bool have_col_names = (lp.col_names_.size() != 0);

  highsLogUser(log_options, HighsLogType::kInfo,
               "  Column        Lower        Upper         Cost       "
               "Type        Count");
  if (have_integer_columns)
    highsLogUser(log_options, HighsLogType::kInfo, "  Discrete");
  if (have_col_names) highsLogUser(log_options, HighsLogType::kInfo, "  Name");
  highsLogUser(log_options, HighsLogType::kInfo, "\n");

  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    type = getBoundType(lp.col_lower_[iCol], lp.col_upper_[iCol]);
    count = lp.a_matrix_.start_[iCol + 1] - lp.a_matrix_.start_[iCol];
    highsLogUser(log_options, HighsLogType::kInfo,
                 "%8" HIGHSINT_FORMAT
                 " %12g %12g %12g         %2s %12" HIGHSINT_FORMAT "",
                 iCol, lp.col_lower_[iCol], lp.col_upper_[iCol],
                 lp.col_cost_[iCol], type.c_str(), count);
    if (have_integer_columns) {
      std::string integer_column = "";
      if (lp.integrality_[iCol] == HighsVarType::kInteger) {
        if (lp.col_lower_[iCol] == 0 && lp.col_upper_[iCol] == 1) {
          integer_column = "Binary";
        } else {
          integer_column = "Integer";
        }
      }
      highsLogUser(log_options, HighsLogType::kInfo, "  %-8s",
                   integer_column.c_str());
    }
    if (have_col_names)
      highsLogUser(log_options, HighsLogType::kInfo, "  %-s",
                   lp.col_names_[iCol].c_str());
    highsLogUser(log_options, HighsLogType::kInfo, "\n");
  }
}